

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestVC.cxx
# Opt level: O0

bool __thiscall
cmCTestVC::RunUpdateCommand
          (cmCTestVC *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *cmd,OutputParser *out,OutputParser *err,Encoding encoding)

{
  OutputParser *err_00;
  OutputParser *out_00;
  OutputParser *cmd_00;
  bool bVar1;
  ostream *poVar2;
  allocator<char> local_79;
  string local_78;
  string local_58;
  Encoding local_34;
  OutputParser *pOStack_30;
  Encoding encoding_local;
  OutputParser *err_local;
  OutputParser *out_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *cmd_local;
  cmCTestVC *this_local;
  
  local_34 = encoding;
  pOStack_30 = err;
  err_local = out;
  out_local = (OutputParser *)cmd;
  cmd_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this;
  ComputeCommandLine(&local_58,cmd);
  std::__cxx11::string::operator=((string *)&this->UpdateCommandLine,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  bVar1 = cmCTest::GetShowOnly(this->CTest);
  cmd_00 = out_local;
  out_00 = err_local;
  err_00 = pOStack_30;
  if (bVar1) {
    poVar2 = std::operator<<(this->Log,(string *)&this->UpdateCommandLine);
    std::operator<<(poVar2,"\n");
    this_local._7_1_ = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_79);
    this_local._7_1_ =
         RunChild(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)cmd_00,out_00,err_00,&local_78,local_34);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmCTestVC::RunUpdateCommand(const std::vector<std::string>& cmd,
                                 OutputParser* out, OutputParser* err,
                                 Encoding encoding)
{
  // Report the command line.
  this->UpdateCommandLine = this->ComputeCommandLine(cmd);
  if (this->CTest->GetShowOnly()) {
    this->Log << this->UpdateCommandLine << "\n";
    return true;
  }

  // Run the command.
  return this->RunChild(cmd, out, err, "", encoding);
}